

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# augmentedmatrix.cpp
# Opt level: O3

bool __thiscall
AugmentedMatrix::setMatrixData(AugmentedMatrix *this,fraction *valves,int width,int height)

{
  fraction *pfVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  this->width = width;
  this->height = height;
  if (0 < height) {
    uVar5 = (ulong)(uint)width * 0x10;
    uVar4 = 0xffffffffffffffff;
    if (-1 < width) {
      uVar4 = uVar5;
    }
    uVar3 = 0;
    do {
      pfVar1 = (fraction *)operator_new__(uVar4);
      if (0 < width) {
        uVar2 = 0;
        do {
          *(unkbyte10 *)((long)pfVar1 + uVar2) = *(unkbyte10 *)((long)valves + uVar2);
          uVar2 = uVar2 + 0x10;
        } while (uVar5 != uVar2);
      }
      this->matrix[uVar3] = pfVar1;
      uVar3 = uVar3 + 1;
      valves = valves + (uint)width;
    } while (uVar3 != (uint)height);
  }
  return true;
}

Assistant:

bool AugmentedMatrix::setMatrixData(fraction *valves , int width, int height)
{
    this->width = width;
    this->height = height;

    for(int i=0 ; i<this->height ; i++)
    {
        fraction *x = new fraction[this->width];
        for(int j=0 ; j<this->width ; j++)
            x[j] = valves[i*this->width + j];
        matrix[i] = x;
    }

    return true;
}